

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::peer_error_alert::peer_error_alert
          (peer_error_alert *this,stack_allocator *alloc,torrent_handle *h,endpoint *ep,
          peer_id *peer_id,operation_t op_,error_code *e)

{
  error_category *peVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  undefined3 uVar5;
  undefined3 in_register_00000089;
  string sStack_38;
  
  peer_alert::peer_alert(&this->super_peer_alert,alloc,h,ep,peer_id);
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__peer_error_alert_00431a38;
  (this->super_peer_alert).field_0x9c = op_;
  bVar4 = e->failed_;
  uVar5 = *(undefined3 *)&e->field_0x5;
  uVar2 = *(undefined4 *)&e->cat_;
  uVar3 = *(undefined4 *)((long)&e->cat_ + 4);
  (this->error).val_ = e->val_;
  (this->error).failed_ = bVar4;
  *(undefined3 *)&(this->error).field_0x5 = uVar5;
  *(undefined4 *)&(this->error).cat_ = uVar2;
  *(undefined4 *)((long)&(this->error).cat_ + 4) = uVar3;
  this->operation = CONCAT31(in_register_00000089,op_);
  peVar1 = (this->error).cat_;
  (*peVar1->_vptr_error_category[4])(&sStack_38,peVar1,(ulong)(uint)(this->error).val_);
  convert_from_native(&this->msg,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

peer_error_alert::peer_error_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, tcp::endpoint const& ep, peer_id const& peer_id, operation_t const op_
		, error_code const& e)
		: peer_alert(alloc, h, ep, peer_id)
		, op(op_)
		, error(e)
#if TORRENT_ABI_VERSION == 1
		, operation(static_cast<int>(op_))
		, msg(convert_from_native(error.message()))
#endif
	{}